

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

environment_infrastructure_factory_t *
so_5::env_infrastructures::simple_not_mtsafe::factory
          (environment_infrastructure_factory_t *__return_storage_ptr__,
          params_t *infrastructure_params)

{
  undefined8 *puVar1;
  _Any_data local_28;
  code *local_18;
  undefined8 uStack_10;
  
  std::
  function<std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>_(std::shared_ptr<so_5::error_logger_t>,_so_5::outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t>)>
  ::function((function<std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>_(std::shared_ptr<so_5::error_logger_t>,_so_5::outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t>)>
              *)&local_28,&infrastructure_params->m_timer_factory);
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = uStack_10;
  if (local_18 != (code *)0x0) {
    *puVar1 = local_28._M_unused._M_object;
    puVar1[1] = local_28._8_8_;
    puVar1[2] = local_18;
    local_18 = (code *)0x0;
    uStack_10 = 0;
  }
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<std::unique_ptr<so_5::environment_infrastructure_t,_void_(*)(so_5::environment_infrastructure_t_*)>_(so_5::environment_t_&,_so_5::environment_params_t_&,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/simple_not_mtsafe_st_env_infrastructure.cpp:667:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<std::unique_ptr<so_5::environment_infrastructure_t,_void_(*)(so_5::environment_infrastructure_t_*)>_(so_5::environment_t_&,_so_5::environment_params_t_&,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/simple_not_mtsafe_st_env_infrastructure.cpp:667:10)>
       ::_M_manager;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

SO_5_FUNC environment_infrastructure_factory_t
factory( params_t && infrastructure_params )
	{
		using namespace impl;

		return [infrastructure_params](
				environment_t & env,
				environment_params_t & env_params,
				mbox_t stats_distribution_mbox )
		{
			ensure_autoshutdown_enabled( env_params );

			environment_infrastructure_t * obj = nullptr;

			const auto & timer_manager_factory =
					infrastructure_params.timer_manager();

			// Create environment infrastructure object in dependence of
			// work thread activity tracking flag.
			const auto tracking = env_params.work_thread_activity_tracking();
			if( work_thread_activity_tracking_t::on == tracking )
				obj = new env_infrastructure_t< reusable::real_activity_tracker_t >(
					env,
					std::move(timer_manager_factory),
					env_params.so5__error_logger(),
					env_params.so5__giveout_coop_listener(),
					std::move(stats_distribution_mbox) );
			else
				obj = new env_infrastructure_t< reusable::fake_activity_tracker_t >(
					env,
					std::move(timer_manager_factory),
					env_params.so5__error_logger(),
					env_params.so5__giveout_coop_listener(),
					std::move(stats_distribution_mbox) );

			return environment_infrastructure_unique_ptr_t(
					obj,
					environment_infrastructure_t::default_deleter() );
		};
	}